

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

bool __thiscall CBlockPolicyEstimator::Read(CBlockPolicyEstimator *this,AutoFile *filein)

{
  vector<double,_std::allocator<double>_> *defaultBuckets;
  map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
  *this_00;
  long lVar1;
  pointer pdVar2;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  __uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true> _Var7;
  mapped_type_conflict2 *pmVar8;
  runtime_error *prVar9;
  int nFileVersion;
  int nFileVersion_00;
  int nFileVersion_01;
  uint i;
  ulong uVar10;
  size_t numBuckets;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> fileLongStats;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> fileShortStats;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> fileFeeStats;
  int nVersionRequired;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  vector<double,_std::allocator<double>_> fileBuckets;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock7,&this->m_cs_fee_estimator,"m_cs_fee_estimator",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
             ,0x3dc,false);
  nVersionRequired = ser_readdata32<AutoFile>(filein);
  ser_readdata32<AutoFile>(filein);
  if (0x46c6c < nVersionRequired) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<int>
              ((string *)&fileBuckets,"up-version (%d) fee estimate file",&nVersionRequired);
    std::runtime_error::runtime_error(prVar9,(string *)&fileBuckets);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_0024f673;
  }
  uVar4 = ser_readdata32<AutoFile>(filein);
  if (nVersionRequired < 0x2498c) {
    logging_function._M_str = "Read";
    logging_function._M_len = 4;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
    ;
    source_file._M_len = 0x5f;
    LogPrintFormatInternal<char[5],int>
              (logging_function,source_file,0x3e9,ALL,Info,(ConstevalFormatString<2U>)0x6a8cab,
               (char (*) [5])"Read",&nVersionRequired);
  }
  else {
    uVar5 = ser_readdata32<AutoFile>(filein);
    uVar6 = ser_readdata32<AutoFile>(filein);
    if ((uVar6 < uVar5) || (uVar4 < uVar6)) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar9,"Corrupt estimates file. Historical block range for estimates is invalid");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0024f673;
    }
    fileFeeStats._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
    _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         &fileBuckets;
    fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    AutoFile::operator>>
              (filein,(Wrapper<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>,_std::vector<double,_std::allocator<double>_>_&>
                       *)&fileFeeStats);
    numBuckets = (long)fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
    if (numBuckets - 0x3e9 < 0xfffffffffffffc19) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar9,"Corrupt estimates file. Must have between 2 and 1000 feerate buckets");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0024f673;
    }
    _Var7.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
    super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)operator_new(0xb0);
    defaultBuckets = &this->buckets;
    this_00 = &this->bucketMap;
    TxConfirmStats::TxConfirmStats
              ((TxConfirmStats *)
               _Var7.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
               _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,defaultBuckets,this_00,
               0x18,0.9952,2);
    fileFeeStats._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
    _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         _Var7.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
         super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
         super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    _Var7.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
    super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)operator_new(0xb0);
    TxConfirmStats::TxConfirmStats
              ((TxConfirmStats *)
               _Var7.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
               _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,defaultBuckets,this_00,
               0xc,0.962,1);
    fileShortStats._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
    _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         _Var7.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
         super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
         super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    _Var7.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
    super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)operator_new(0xb0);
    TxConfirmStats::TxConfirmStats
              ((TxConfirmStats *)
               _Var7.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
               _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,defaultBuckets,this_00,
               0x2a,0.99931,0x18);
    fileLongStats._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
    _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         _Var7.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
         super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
         super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    TxConfirmStats::Read
              ((TxConfirmStats *)
               fileFeeStats._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,filein,nFileVersion,
               numBuckets);
    TxConfirmStats::Read
              ((TxConfirmStats *)
               fileShortStats._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,filein,nFileVersion_00,
               numBuckets);
    TxConfirmStats::Read
              ((TxConfirmStats *)
               fileLongStats._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,filein,nFileVersion_01,
               numBuckets);
    std::vector<double,_std::allocator<double>_>::operator=(defaultBuckets,&fileBuckets);
    std::
    _Rb_tree<double,_std::pair<const_double,_unsigned_int>,_std::_Select1st<std::pair<const_double,_unsigned_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
    ::clear(&this_00->_M_t);
    uVar10 = 0;
    while( true ) {
      uVar3._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
      super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
      super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
           fileFeeStats._M_t.
           super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
           super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
           super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
      pdVar2 = (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar2 >> 3) <= uVar10) break;
      pmVar8 = std::
               map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
               ::operator[](this_00,pdVar2 + uVar10);
      *pmVar8 = (mapped_type_conflict2)uVar10;
      uVar10 = (ulong)((mapped_type_conflict2)uVar10 + 1);
    }
    fileFeeStats._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
    _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         (__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)0x0;
    std::__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::reset
              ((__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               &this->feeStats,
               (pointer)uVar3._M_t.
                        super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>
                        .super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl);
    uVar3 = fileShortStats;
    fileShortStats._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
    _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         (__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)0x0;
    std::__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::reset
              ((__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               &this->shortStats,
               (pointer)uVar3._M_t.
                        super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>
                        .super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl);
    uVar3 = fileLongStats;
    fileLongStats._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
    _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         (__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)0x0;
    std::__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::reset
              ((__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               &this->longStats,
               (pointer)uVar3._M_t.
                        super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>
                        .super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl);
    this->nBestSeenHeight = uVar4;
    this->historicalFirst = uVar5;
    this->historicalBest = uVar6;
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::~unique_ptr
              (&fileLongStats);
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::~unique_ptr
              (&fileShortStats);
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::~unique_ptr
              (&fileFeeStats);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&fileBuckets.super__Vector_base<double,_std::allocator<double>_>);
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock7.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
LAB_0024f673:
  __stack_chk_fail();
}

Assistant:

bool CBlockPolicyEstimator::Read(AutoFile& filein)
{
    try {
        LOCK(m_cs_fee_estimator);
        int nVersionRequired, nVersionThatWrote;
        filein >> nVersionRequired >> nVersionThatWrote;
        if (nVersionRequired > CLIENT_VERSION) {
            throw std::runtime_error(strprintf("up-version (%d) fee estimate file", nVersionRequired));
        }

        // Read fee estimates file into temporary variables so existing data
        // structures aren't corrupted if there is an exception.
        unsigned int nFileBestSeenHeight;
        filein >> nFileBestSeenHeight;

        if (nVersionRequired < 149900) {
            LogPrintf("%s: incompatible old fee estimation data (non-fatal). Version: %d\n", __func__, nVersionRequired);
        } else { // New format introduced in 149900
            unsigned int nFileHistoricalFirst, nFileHistoricalBest;
            filein >> nFileHistoricalFirst >> nFileHistoricalBest;
            if (nFileHistoricalFirst > nFileHistoricalBest || nFileHistoricalBest > nFileBestSeenHeight) {
                throw std::runtime_error("Corrupt estimates file. Historical block range for estimates is invalid");
            }
            std::vector<double> fileBuckets;
            filein >> Using<VectorFormatter<EncodedDoubleFormatter>>(fileBuckets);
            size_t numBuckets = fileBuckets.size();
            if (numBuckets <= 1 || numBuckets > 1000) {
                throw std::runtime_error("Corrupt estimates file. Must have between 2 and 1000 feerate buckets");
            }

            std::unique_ptr<TxConfirmStats> fileFeeStats(new TxConfirmStats(buckets, bucketMap, MED_BLOCK_PERIODS, MED_DECAY, MED_SCALE));
            std::unique_ptr<TxConfirmStats> fileShortStats(new TxConfirmStats(buckets, bucketMap, SHORT_BLOCK_PERIODS, SHORT_DECAY, SHORT_SCALE));
            std::unique_ptr<TxConfirmStats> fileLongStats(new TxConfirmStats(buckets, bucketMap, LONG_BLOCK_PERIODS, LONG_DECAY, LONG_SCALE));
            fileFeeStats->Read(filein, nVersionThatWrote, numBuckets);
            fileShortStats->Read(filein, nVersionThatWrote, numBuckets);
            fileLongStats->Read(filein, nVersionThatWrote, numBuckets);

            // Fee estimates file parsed correctly
            // Copy buckets from file and refresh our bucketmap
            buckets = fileBuckets;
            bucketMap.clear();
            for (unsigned int i = 0; i < buckets.size(); i++) {
                bucketMap[buckets[i]] = i;
            }

            // Destroy old TxConfirmStats and point to new ones that already reference buckets and bucketMap
            feeStats = std::move(fileFeeStats);
            shortStats = std::move(fileShortStats);
            longStats = std::move(fileLongStats);

            nBestSeenHeight = nFileBestSeenHeight;
            historicalFirst = nFileHistoricalFirst;
            historicalBest = nFileHistoricalBest;
        }
    }
    catch (const std::exception& e) {
        LogPrintf("CBlockPolicyEstimator::Read(): unable to read policy estimator data (non-fatal): %s\n",e.what());
        return false;
    }
    return true;
}